

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HMpsFF.cpp
# Opt level: O3

Parsekey __thiscall
free_format_parser::HMpsFF::parseQuadRows
          (HMpsFF *this,HighsLogOptions *log_options,istream *file,Parsekey keyword)

{
  byte bVar1;
  bool bVar2;
  Parsekey PVar3;
  int iVar4;
  HighsInt HVar5;
  iterator iVar6;
  long lVar7;
  size_t start;
  pointer start_00;
  HighsInt id;
  char *pcVar8;
  Parsekey PVar9;
  HMpsFF *this_00;
  double dVar10;
  pointer pcVar11;
  bool is_nan;
  bool skip;
  bool skip_1;
  size_t end;
  size_t begin;
  string row_name;
  string strline;
  string section_name;
  string coeff_name;
  string col_name;
  string rowname;
  bool local_146;
  bool local_145;
  HighsInt local_144;
  HMpsFF *local_140;
  pointer local_138;
  size_t local_130;
  HMpsFF *local_128;
  Parsekey local_11c;
  string local_118;
  undefined1 local_f8 [8];
  char *local_f0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_e8;
  string local_d8;
  undefined8 local_b8;
  undefined1 *local_b0;
  double local_a8;
  undefined1 local_a0 [16];
  string local_90;
  string local_70;
  string local_50;
  
  local_b0 = local_a0;
  local_a8 = 0.0;
  local_a0[0] = 0;
  pcVar8 = "QSECTION";
  if (keyword == kQcmatrix) {
    pcVar8 = "QCMATRIX";
  }
  local_140 = (HMpsFF *)log_options;
  local_11c = keyword;
  std::__cxx11::string::_M_replace((ulong)&local_b0,0,(char *)0x0,(ulong)pcVar8);
  local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
  local_d8._M_string_length = 0;
  local_d8.field_2._M_local_buf[0] = '\0';
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  local_70._M_string_length = 0;
  local_70.field_2._M_local_buf[0] = '\0';
  local_f8 = (undefined1  [8])&local_e8;
  local_f0 = (char *)0x0;
  local_e8._M_local_buf[0] = '\0';
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  local_90._M_string_length = 0;
  local_90.field_2._M_local_buf[0] = '\0';
  first_word(&local_50,&this->section_args,0);
  if ((pointer)local_50._M_string_length == (pointer)0x0) {
    PVar3 = kFail;
    highsLogUser((HighsLogOptions *)local_140,kError,"No row name given in argument of %s\n",
                 local_b0);
    goto LAB_001f83fe;
  }
  this_00 = (HMpsFF *)&this->rowname2idx;
  iVar6 = std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::find((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                  *)this_00,&local_50);
  local_b8 = file;
  if (iVar6.
      super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_true>
      ._M_cur == (__node_type *)0x0) {
    this->warning_issued_ = true;
    this_00 = local_140;
    highsLogUser((HighsLogOptions *)local_140,kWarning,
                 "Row name \"%s\" in %s section is not defined: ignored\n",local_50._M_dataplus._M_p
                 ,local_b0);
  }
  else {
    iVar4 = *(int *)((long)iVar6.
                           super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_true>
                           ._M_cur + 0x28);
    if ((long)iVar4 != -2) {
      if (iVar4 < 0) {
        if (iVar4 != -1) goto LAB_001f80f3;
        local_128 = (HMpsFF *)&this->q_entries;
      }
      else {
        this_00 = (HMpsFF *)&this->qrows_entries;
        std::
        vector<std::vector<std::tuple<int,_int,_double>,_std::allocator<std::tuple<int,_int,_double>_>_>,_std::allocator<std::vector<std::tuple<int,_int,_double>,_std::allocator<std::tuple<int,_int,_double>_>_>_>_>
        ::resize((vector<std::vector<std::tuple<int,_int,_double>,_std::allocator<std::tuple<int,_int,_double>_>_>,_std::allocator<std::vector<std::tuple<int,_int,_double>,_std::allocator<std::tuple<int,_int,_double>_>_>_>_>
                  *)this_00,(long)this->num_row);
LAB_001f80f3:
        local_128 = (HMpsFF *)
                    ((this->qrows_entries).
                     super__Vector_base<std::vector<std::tuple<int,_int,_double>,_std::allocator<std::tuple<int,_int,_double>_>_>,_std::allocator<std::vector<std::tuple<int,_int,_double>,_std::allocator<std::tuple<int,_int,_double>_>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start + iVar4);
      }
      PVar9 = kFail;
LAB_001f811e:
      bVar2 = getMpsLine(this_00,(istream *)local_b8,&local_d8,&local_145);
      PVar3 = PVar9;
      if (bVar2) {
        if (local_145 == false) {
          if ((0.0 < this->time_limit_) &&
             (lVar7 = std::chrono::_V2::system_clock::now(),
             dVar10 = (double)lVar7 / 1000000000.0 - this->start_time,
             this->time_limit_ <= dVar10 && dVar10 != this->time_limit_)) goto LAB_001f83f9;
          local_130 = 0;
          local_138 = (pointer)0x0;
          PVar3 = checkFirstWord(this,&local_d8,&local_130,(size_t *)&local_138,&local_70);
          if (PVar3 != kNone) {
            highsLogDev((HighsLogOptions *)local_140,kInfo,"readMPS: Read %s  OK\n",local_b0);
            goto LAB_001f83fe;
          }
          local_144 = getColIdx(this,&local_70,true);
          bVar1 = 1;
          start_00 = local_138;
          do {
            std::__cxx11::string::_M_replace((ulong)local_f8,0,local_f0,0x3cbf27);
            first_word(&local_118,&local_d8,(size_t)start_00);
            std::__cxx11::string::operator=((string *)local_f8,(string *)&local_118);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_118._M_dataplus._M_p != &local_118.field_2) {
              operator_delete(local_118._M_dataplus._M_p);
            }
            start = first_word_end(&local_d8,(size_t)start_00);
            this_00 = (HMpsFF *)local_f8;
            iVar4 = std::__cxx11::string::compare((char *)this_00);
            if (iVar4 == 0) break;
            id = 0x3cbf27;
            std::__cxx11::string::_M_replace
                      ((ulong)&local_90,0,(char *)local_90._M_string_length,0x3cbf27);
            first_word(&local_118,&local_d8,start);
            std::__cxx11::string::operator=((string *)&local_90,(string *)&local_118);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_118._M_dataplus._M_p != &local_118.field_2) {
              operator_delete(local_118._M_dataplus._M_p);
            }
            start_00 = (pointer)first_word_end(&local_d8,start);
            iVar4 = std::__cxx11::string::compare((char *)&local_90);
            if (iVar4 == 0) {
              trim((string *)local_f8,&default_non_chars_abi_cxx11_);
              trim(&local_70,&default_non_chars_abi_cxx11_);
              highsLogUser((HighsLogOptions *)local_140,kError,
                           "%s has no coefficient for entry \"%s\" in column \"%s\"\n",local_b0,
                           local_f8,local_70._M_dataplus._M_p);
              PVar3 = PVar9;
              goto LAB_001f83fe;
            }
            this_00 = this;
            HVar5 = getColIdx(this,(string *)local_f8,true);
            local_146 = false;
            pcVar11 = (pointer)getValue(this_00,&local_90,&local_146,id);
            if (local_146 == true) {
              highsLogUser((HighsLogOptions *)local_140,kError,
                           "Hessian coefficient for entry \"%s\" in column \"%s\" is NaN\n",local_f8
                           ,local_70._M_dataplus._M_p);
              PVar3 = PVar9;
              goto LAB_001f83fe;
            }
            if (((double)pcVar11 != 0.0) || (NAN((double)pcVar11))) {
              if (local_11c == kQcmatrix) {
                if (local_144 <= HVar5) {
                  local_118._M_string_length._0_4_ = local_144;
                  this_00 = local_128;
                  local_118._M_dataplus._M_p = pcVar11;
                  local_118._M_string_length._4_4_ = HVar5;
                  std::vector<std::tuple<int,int,double>,std::allocator<std::tuple<int,int,double>>>
                  ::emplace_back<std::tuple<int,int,double>>
                            ((vector<std::tuple<int,int,double>,std::allocator<std::tuple<int,int,double>>>
                              *)local_128,(tuple<int,_int,_double> *)&local_118);
                }
              }
              else {
                local_118._M_string_length._0_4_ = local_144;
                this_00 = local_128;
                local_118._M_dataplus._M_p = pcVar11;
                local_118._M_string_length._4_4_ = HVar5;
                std::vector<std::tuple<int,int,double>,std::allocator<std::tuple<int,int,double>>>::
                emplace_back<std::tuple<int,int,double>>
                          ((vector<std::tuple<int,int,double>,std::allocator<std::tuple<int,int,double>>>
                            *)local_128,(tuple<int,_int,_double> *)&local_118);
              }
            }
            bVar2 = (bool)(start_00 != (pointer)local_d8._M_string_length & bVar1);
            bVar1 = 0;
          } while (bVar2);
        }
        goto LAB_001f811e;
      }
      goto LAB_001f83fe;
    }
  }
  do {
    do {
      bVar2 = getMpsLine(this_00,file,&local_d8,(bool *)&local_138);
      if (!bVar2) {
        PVar3 = kFail;
        goto LAB_001f83fe;
      }
    } while ((char)local_138 != '\0');
    if ((0.0 < this->time_limit_) &&
       (lVar7 = std::chrono::_V2::system_clock::now(),
       dVar10 = (double)lVar7 / 1000000000.0 - this->start_time,
       this->time_limit_ <= dVar10 && dVar10 != this->time_limit_)) goto LAB_001f83f9;
    local_118._M_dataplus._M_p = (pointer)0x0;
    local_130 = 0;
    this_00 = this;
    PVar3 = checkFirstWord(this,&local_d8,(size_t *)&local_118,&local_130,&local_70);
    file = (istream *)local_b8;
  } while (PVar3 == kNone);
  highsLogDev((HighsLogOptions *)local_140,kInfo,"readMPS: Read %s  OK\n",local_b0);
LAB_001f83fe:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p);
  }
  if (local_f8 != (undefined1  [8])&local_e8) {
    operator_delete((void *)local_f8);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
    operator_delete(local_d8._M_dataplus._M_p);
  }
  if (local_b0 != local_a0) {
    operator_delete(local_b0);
  }
  return PVar3;
LAB_001f83f9:
  PVar3 = kTimeout;
  goto LAB_001f83fe;
}

Assistant:

typename HMpsFF::Parsekey HMpsFF::parseQuadRows(
    const HighsLogOptions& log_options, std::istream& file,
    const HMpsFF::Parsekey keyword) {
  // Parse Hessian information from QSECTION or QCMATRIX
  // section according to keyword
  const bool qcmatrix = keyword == HMpsFF::Parsekey::kQcmatrix;
  std::string section_name;
  if (qcmatrix) {
    section_name = "QCMATRIX";
  } else {
    section_name = "QSECTION";
  }
  std::string strline;
  std::string col_name;
  std::string row_name;
  std::string coeff_name;
  size_t end_row_name;
  size_t end_coeff_name;
  HighsInt rowidx;            // index of quadratic row
  HighsInt qcolidx, qrowidx;  // indices in quadratic coefs matrix

  // Get row name from section argument
  std::string rowname = first_word(section_args, 0);
  if (rowname.empty()) {
    highsLogUser(log_options, HighsLogType::kError,
                 "No row name given in argument of %s\n", section_name.c_str());
    return HMpsFF::Parsekey::kFail;
  }

  auto mit = rowname2idx.find(rowname);
  // if row of section does not exist or is free (index -2), then skip
  if (mit == rowname2idx.end() || mit->second == -2) {
    if (mit == rowname2idx.end()) {
      warning_issued_ = true;
      highsLogUser(log_options, HighsLogType::kWarning,
                   "Row name \"%s\" in %s section is not defined: ignored\n",
                   rowname.c_str(), section_name.c_str());
    }
    // read lines until start of new section
    bool skip;
    while (getMpsLine(file, strline, skip)) {
      if (skip) continue;
      if (timeout()) return HMpsFF::Parsekey::kTimeout;

      size_t begin = 0;
      size_t end = 0;
      HMpsFF::Parsekey key = checkFirstWord(strline, begin, end, col_name);

      // start of new section?
      if (key != Parsekey::kNone) {
        highsLogDev(log_options, HighsLogType::kInfo, "readMPS: Read %s  OK\n",
                    section_name.c_str());
        return key;
      }
    }
    return Parsekey::kFail;  // unexpected end of file
  }
  rowidx = mit->second;
  assert(rowidx >= -1);
  assert(rowidx < num_row);

  if (rowidx >= 0) qrows_entries.resize(num_row);
  assert(rowidx == -1 || qrows_entries.size() == static_cast<size_t>(num_row));

  auto& qentries = (rowidx == -1 ? q_entries : qrows_entries[rowidx]);

  bool skip;
  while (getMpsLine(file, strline, skip)) {
    if (skip) continue;
    if (timeout()) return HMpsFF::Parsekey::kTimeout;

    size_t begin = 0;
    size_t end = 0;
    HMpsFF::Parsekey key = checkFirstWord(strline, begin, end, col_name);

    // start of new section?
    if (key != Parsekey::kNone) {
      highsLogDev(log_options, HighsLogType::kInfo, "readMPS: Read %s  OK\n",
                  section_name.c_str());
      return key;
    }

    // Get the column index
    qcolidx = getColIdx(col_name);
    assert(qcolidx >= 0 && qcolidx < num_col);

    // Loop over the maximum of two entries per row of the file
    for (int entry = 0; entry < 2; entry++) {
      // Get the row name
      row_name = "";
      row_name = first_word(strline, end);
      end_row_name = first_word_end(strline, end);

      if (row_name == "") break;

      coeff_name = "";
      coeff_name = first_word(strline, end_row_name);
      end_coeff_name = first_word_end(strline, end_row_name);

      if (coeff_name == "") {
        trim(row_name);
        trim(col_name);
        highsLogUser(
            log_options, HighsLogType::kError,
            "%s has no coefficient for entry \"%s\" in column \"%s\"\n",
            section_name.c_str(), row_name.c_str(), col_name.c_str());
        return HMpsFF::Parsekey::kFail;
      }

      qrowidx = getColIdx(row_name);
      assert(qrowidx >= 0 && qrowidx < num_col);

      bool is_nan = false;
      double coeff = getValue(coeff_name, is_nan);  // atof(word.c_str());
      if (is_nan) {
        highsLogUser(
            log_options, HighsLogType::kError,
            "Hessian coefficient for entry \"%s\" in column \"%s\" is NaN\n",
            row_name.c_str(), col_name.c_str());
        return HMpsFF::Parsekey::kFail;
      }
      if (coeff) {
        if (qcmatrix) {
          // QCMATRIX has the whole Hessian, so store the entry if the
          // entry is in the lower triangle
          if (qrowidx >= qcolidx)
            qentries.push_back(std::make_tuple(qrowidx, qcolidx, coeff));
        } else {
          // QSECTION has the lower triangle of the Hessian
          qentries.push_back(std::make_tuple(qrowidx, qcolidx, coeff));
        }
      }
      end = end_coeff_name;
      // Don't read more if end of line reached
      if (end == strline.length()) break;
    }
  }

  return HMpsFF::Parsekey::kFail;
}